

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger64
          (Parser *this,uint64 max_value,uint64 *output,char *error)

{
  TokenType TVar1;
  bool bVar2;
  allocator local_39;
  string local_38;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    bVar2 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,max_value,output);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_38,"Integer out of range.",&local_39);
      AddError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      *output = 0;
    }
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,error,&local_39);
    AddError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return TVar1 == TYPE_INTEGER;
}

Assistant:

bool Parser::ConsumeInteger64(uint64 max_value, uint64* output,
                              const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    if (!io::Tokenizer::ParseInteger(input_->current().text, max_value,
                                     output)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
      *output = 0;
    }
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}